

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsValueRef
WScriptJsrt::ReadLineStdinCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  char *pcVar1;
  int iVar2;
  JsValueRef local_88;
  JsValueRef stringObject;
  JsValueRef emptyStringObject;
  char *pcStack_70;
  int gotlength;
  char *tmp;
  char *buf;
  int bufsize;
  int buflength;
  PAL_FILE *from;
  int BUFSIZE;
  JsErrorCode errorCode;
  JsValueRef returnValue;
  void *pvStack_38;
  HRESULT hr;
  void *callbackState_local;
  JsValueRef *ppvStack_28;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef pvStack_18;
  bool isConstructCall_local;
  JsValueRef callee_local;
  
  returnValue._4_4_ = 0x80004005;
  _BUFSIZE = (JsValueRef)0x0;
  from._4_4_ = JsNoError;
  from._0_4_ = 0x100;
  pvStack_38 = callbackState;
  callbackState_local._6_2_ = argumentCount;
  ppvStack_28 = arguments;
  arguments_local._7_1_ = isConstructCall;
  pvStack_18 = callee;
  _bufsize = PAL_get_stdin(0);
  buf._4_4_ = 0;
  buf._0_4_ = 0x100;
  tmp = (char *)malloc(0x100);
  emptyStringObject._4_4_ = 0;
  pcVar1 = tmp;
  if (tmp != (char *)0x0) {
    while (tmp = pcVar1,
          emptyStringObject._4_4_ = JsFgets(tmp + buf._4_4_,(int)buf - buf._4_4_,_bufsize),
          0 < emptyStringObject._4_4_) {
      buf._4_4_ = emptyStringObject._4_4_ + buf._4_4_;
      if ((tmp[buf._4_4_ + -2] == '\r') && (tmp[buf._4_4_ + -1] == '\n')) {
        tmp[buf._4_4_ + -1] = '\0';
        tmp[buf._4_4_ + -2] = '\0';
        buf._4_4_ = buf._4_4_ + -2;
        break;
      }
      if (tmp[buf._4_4_ + -1] == '\n') {
        tmp[buf._4_4_ + -1] = '\0';
        buf._4_4_ = buf._4_4_ + -1;
        break;
      }
      if (buf._4_4_ < (int)buf + -1) break;
      buf._0_4_ = (int)buf << 1;
      if (((int)buf <= buf._4_4_) ||
         (pcStack_70 = (char *)realloc(tmp,(long)(int)buf), pcVar1 = pcStack_70,
         pcStack_70 == (char *)0x0)) goto LAB_0011913a;
    }
    if (buf._4_4_ == 0) {
      iVar2 = PAL_feof(_bufsize);
      if (iVar2 == 0) {
        from._4_4_ = ChakraRTInterface::JsCreateString(tmp,(long)buf._4_4_,&stringObject);
        if (from._4_4_ == JsNoError) {
          free(tmp);
          return stringObject;
        }
        returnValue._4_4_ = 0x80004005;
      }
    }
    else {
      from._4_4_ = ChakraRTInterface::JsCreateString(tmp,(long)buf._4_4_,&local_88);
      if (from._4_4_ == JsNoError) {
        free(tmp);
        return local_88;
      }
      returnValue._4_4_ = 0x80004005;
    }
  }
LAB_0011913a:
  if (tmp != (char *)0x0) {
    free(tmp);
  }
  return _BUFSIZE;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::ReadLineStdinCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    const int BUFSIZE = 256;
    FILE* from = stdin;
    int buflength = 0;
    int bufsize = BUFSIZE;
    char* buf = static_cast<char*>(malloc(bufsize));
    char* tmp;
    int gotlength = 0;

    if (!buf)
    {
        goto Error;
    }

    while ((gotlength = JsFgets(buf + buflength, bufsize - buflength, from)) > 0) 
    {
        buflength += gotlength;

        // are we done?
        if (buf[buflength - 2] == '\r' && buf[buflength - 1] == '\n') 
        {
            buf[buflength - 1] = '\0';
            buf[buflength - 2] = '\0';
            buflength -= 2;
            break;
        }
        else if (buf[buflength - 1] == '\n') 
        {
            buf[buflength - 1] = '\0';
            buflength -= 1;
            break;
        }
        else if (buflength < bufsize - 1) 
        {
            break;
        }

        // Else, grow our buffer for another pass.
        bufsize *= 2;
        if (bufsize > buflength) 
        {
            tmp = static_cast<char*>(realloc(buf, bufsize));
        }
        else 
        {
            goto Error;
        }

        if (!tmp) 
        {
            goto Error;
        }

        buf = tmp;
    }

    //Treat the empty string specially.
    if (buflength == 0) 
    {
        if (feof(from)) 
        {
            goto Error;
        }
        else 
        {
            JsValueRef emptyStringObject;
            IfJsrtErrorSetGo(ChakraRTInterface::JsCreateString(buf, buflength, &emptyStringObject));
            free(buf);
            return emptyStringObject;
        }
    }

   
    // Turn buf into a JSString. Note that buflength includes the trailing null character.
    JsValueRef stringObject;
    IfJsrtErrorSetGo(ChakraRTInterface::JsCreateString(buf, buflength, &stringObject));
    free(buf);
    return stringObject;

Error:
    if (buf)
    {
        free(buf);
    }
    return returnValue;
}